

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr,CNetAddr *mask)

{
  Network NVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  CSubNet *pCVar8;
  byte bVar9;
  long in_FS_OFFSET;
  bool bVar10;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet(this);
  NVar1 = addr->m_net;
  if (NVar1 - NET_IPV4 < 2) {
    bVar10 = NVar1 == mask->m_net;
    this->valid = bVar10;
    if (bVar10) {
      uVar2 = (mask->m_addr)._size;
      if (0x10 < uVar2) {
        mask = (CNetAddr *)(mask->m_addr)._union.indirect_contents.indirect;
        uVar2 = uVar2 - 0x11;
      }
      bVar9 = 0;
      for (sVar7 = 0; (long)(int)uVar2 != sVar7; sVar7 = sVar7 + 1) {
        uVar4 = NetmaskBits((mask->m_addr)._union.direct[sVar7]);
        if ((uVar4 == 0xffffffff) || ((bool)(uVar4 != 0 & bVar9))) goto LAB_00597ca6;
        bVar9 = bVar9 | uVar4 < 8;
      }
      if (0x10 < uVar2) {
        __assert_fail("mask.m_addr.size() <= sizeof(netmask)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                      ,0x3d6,"CSubNet::CSubNet(const CNetAddr &, const CNetAddr &)");
      }
      memcpy(this->netmask,mask,(long)(int)uVar2);
      CNetAddr::operator=(&this->network,addr);
      lVar5 = 0;
      uVar6 = 0;
      while( true ) {
        uVar2 = (this->network).m_addr._size;
        uVar4 = uVar2 - 0x11;
        if (uVar2 < 0x11) {
          uVar4 = uVar2;
        }
        if (uVar4 <= uVar6) break;
        pCVar8 = this;
        if (0x10 < uVar2) {
          pCVar8 = (CSubNet *)(this->network).m_addr._union.indirect_contents.indirect;
        }
        pCVar8->netmask[(lVar5 >> 0x20) + -0x20] =
             pCVar8->netmask[(lVar5 >> 0x20) + -0x20] & this->netmask[uVar6];
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x100000000;
      }
    }
  }
  else {
LAB_00597ca6:
    this->valid = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr, const CNetAddr& mask) : CSubNet()
{
    valid = (addr.IsIPv4() || addr.IsIPv6()) && addr.m_net == mask.m_net;
    if (!valid) {
        return;
    }
    // Check if `mask` contains 1-bits after 0-bits (which is an invalid netmask).
    bool zeros_found = false;
    for (auto b : mask.m_addr) {
        const int num_bits = NetmaskBits(b);
        if (num_bits == -1 || (zeros_found && num_bits != 0)) {
            valid = false;
            return;
        }
        if (num_bits < 8) {
            zeros_found = true;
        }
    }

    assert(mask.m_addr.size() <= sizeof(netmask));

    memcpy(netmask, mask.m_addr.data(), mask.m_addr.size());

    network = addr;

    // Normalize network according to netmask
    for (size_t x = 0; x < network.m_addr.size(); ++x) {
        network.m_addr[x] &= netmask[x];
    }
}